

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

int run_test_fs_readdir_non_existing_dir(void)

{
  char *__s1;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_fs_t *puVar3;
  uv_fs_t *puVar4;
  long lVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t uStack_970;
  uv_loop_t *puStack_7b0;
  long lStack_7a0;
  long lStack_798;
  uv_fs_t uStack_790;
  uv_fs_t uStack_5d0;
  uv_fs_t uStack_410;
  uv_fs_t uStack_250;
  uv_loop_t *puStack_90;
  undefined1 auStack_40 [56];
  
  auStack_40._32_8_ = (void *)0x1880ad;
  memset(&opendir_req,0xdb,0x1c0);
  auStack_40._32_8_ = (void *)0x1880b2;
  puVar2 = uv_default_loop();
  auStack_40._32_8_ = (void *)0x1880c6;
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",(uv_fs_cb)0x0);
  auStack_40._48_8_ = SEXT48(iVar1);
  auStack_40._40_8_ = (void *)0xfffffffffffffffe;
  if ((void *)auStack_40._48_8_ == (void *)0xfffffffffffffffe) {
    auStack_40._48_8_ = SEXT48(opendir_req.fs_type);
    auStack_40._40_8_ = (void *)0x1f;
    if ((void *)auStack_40._48_8_ != (void *)0x1f) goto LAB_0018826e;
    auStack_40._48_8_ = opendir_req.result;
    auStack_40._40_8_ = (void *)0xfffffffffffffffe;
    if (opendir_req.result != -2) goto LAB_0018827b;
    if (opendir_req.ptr != (void *)0x0) goto LAB_00188288;
    auStack_40._32_8_ = (void *)0x188149;
    uv_fs_req_cleanup(&opendir_req);
    auStack_40._32_8_ = (void *)0x18815b;
    memset(&opendir_req,0xdb,0x1c0);
    auStack_40._32_8_ = (void *)0x188160;
    puVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x188179;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    auStack_40._48_8_ = SEXT48(iVar1);
    auStack_40._40_8_ = (void *)0x0;
    if ((void *)auStack_40._48_8_ != (void *)0x0) goto LAB_0018828d;
    auStack_40._48_8_ = SEXT48(non_existing_opendir_cb_count);
    auStack_40._40_8_ = (void *)0x0;
    if ((void *)auStack_40._48_8_ != (void *)0x0) goto LAB_0018829a;
    auStack_40._32_8_ = (void *)0x1881bf;
    puVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x1881c9;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_40._48_8_ = SEXT48(iVar1);
    auStack_40._40_8_ = (void *)0x0;
    if ((void *)auStack_40._48_8_ != (void *)0x0) goto LAB_001882a7;
    auStack_40._48_8_ = (void *)0x1;
    auStack_40._40_8_ = SEXT48(non_existing_opendir_cb_count);
    if ((void *)auStack_40._40_8_ != (void *)0x1) goto LAB_001882b4;
    auStack_40._32_8_ = (void *)0x18820f;
    puVar3 = (uv_fs_t *)uv_default_loop();
    auStack_40._32_8_ = (void *)0x188223;
    uv_walk((uv_loop_t *)puVar3,close_walk_cb,(void *)0x0);
    auStack_40._32_8_ = (void *)0x18822d;
    uv_run((uv_loop_t *)puVar3,UV_RUN_DEFAULT);
    auStack_40._48_8_ = (void *)0x0;
    auStack_40._32_8_ = (void *)0x18823b;
    puVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x188243;
    iVar1 = uv_loop_close(puVar2);
    auStack_40._40_8_ = SEXT48(iVar1);
    if (auStack_40._48_8_ == auStack_40._40_8_) {
      auStack_40._32_8_ = (void *)0x188259;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_40._32_8_ = (void *)0x18826e;
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_0018826e:
    auStack_40._32_8_ = (void *)0x18827b;
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_0018827b:
    auStack_40._32_8_ = (void *)0x188288;
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_00188288:
    auStack_40._32_8_ = (void *)0x18828d;
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_0018828d:
    auStack_40._32_8_ = (void *)0x18829a;
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_0018829a:
    auStack_40._32_8_ = (void *)0x1882a7;
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_001882a7:
    auStack_40._32_8_ = (void *)0x1882b4;
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_001882b4:
    puVar3 = &opendir_req;
    auStack_40._32_8_ = (void *)0x1882c1;
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  puVar4 = (uv_fs_t *)(auStack_40 + 0x30);
  auStack_40._32_8_ = non_existing_opendir_cb;
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar4 == &opendir_req) {
    auStack_40._32_8_ = SEXT48(opendir_req.fs_type);
    auStack_40._24_8_ = (void *)0x1f;
    if ((code *)auStack_40._32_8_ != (code *)0x1f) goto LAB_00188348;
    auStack_40._32_8_ = opendir_req.result;
    auStack_40._24_8_ = (void *)0xfffffffffffffffe;
    if (opendir_req.result != -2) goto LAB_00188357;
    if (opendir_req.ptr == (void *)0x0) {
      auStack_40._8_8_ = (uv_loop_t *)0x188338;
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    auStack_40._8_8_ = (uv_loop_t *)0x188348;
    non_existing_opendir_cb_cold_1();
LAB_00188348:
    auStack_40._8_8_ = (uv_loop_t *)0x188357;
    non_existing_opendir_cb_cold_2();
LAB_00188357:
    auStack_40._8_8_ = (uv_loop_t *)0x188366;
    non_existing_opendir_cb_cold_3();
  }
  auStack_40._8_8_ = run_test_fs_readdir_file;
  non_existing_opendir_cb_cold_4();
  auStack_40._8_8_ = puVar3;
  memset(&opendir_req,0xdb,0x1c0);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",(uv_fs_cb)0x0);
  auStack_40._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_40._0_8_ == (void *)0xffffffffffffffec) {
    auStack_40._0_8_ = SEXT48(opendir_req.fs_type);
    if ((void *)auStack_40._0_8_ != (void *)0x1f) goto LAB_0018854a;
    auStack_40._0_8_ = opendir_req.result;
    if (opendir_req.result != -0x14) goto LAB_00188557;
    if (opendir_req.ptr != (void *)0x0) goto LAB_00188564;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1c0);
    puVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    auStack_40._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_00188569;
    auStack_40._0_8_ = SEXT48(file_opendir_cb_count);
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_00188576;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_40._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_00188583;
    auStack_40._0_8_ = (void *)0x1;
    if (file_opendir_cb_count != 1) goto LAB_00188590;
    puVar3 = (uv_fs_t *)uv_default_loop();
    uv_walk((uv_loop_t *)puVar3,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)puVar3,UV_RUN_DEFAULT);
    auStack_40._0_8_ = (void *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if ((void *)auStack_40._0_8_ == (void *)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0018854a:
    run_test_fs_readdir_file_cold_2();
LAB_00188557:
    run_test_fs_readdir_file_cold_3();
LAB_00188564:
    run_test_fs_readdir_file_cold_4();
LAB_00188569:
    run_test_fs_readdir_file_cold_5();
LAB_00188576:
    run_test_fs_readdir_file_cold_6();
LAB_00188583:
    run_test_fs_readdir_file_cold_7();
LAB_00188590:
    puVar3 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  puVar4 = (uv_fs_t *)auStack_40;
  run_test_fs_readdir_file_cold_9();
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00188624;
    if (opendir_req.result != -0x14) goto LAB_00188633;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_00188624:
    file_opendir_cb_cold_2();
LAB_00188633:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_7b0 = (uv_loop_t *)0x18865d;
  puStack_90 = (uv_loop_t *)puVar3;
  cleanup_test_files();
  puStack_7b0 = (uv_loop_t *)0x188662;
  puVar2 = uv_default_loop();
  puStack_7b0 = (uv_loop_t *)0x188681;
  iVar1 = uv_fs_mkdir(puVar2,&uStack_250,"test_dir",0x1ed,(uv_fs_cb)0x0);
  uStack_790.data = (void *)(long)iVar1;
  uStack_410.data = (void *)0x0;
  if ((uv_loop_t *)uStack_790.data == (uv_loop_t *)0x0) {
    puStack_7b0 = (uv_loop_t *)0x1886ac;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x1886d1;
    iVar1 = uv_fs_open(puVar2,&uStack_410,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    puVar4 = (uv_fs_t *)uStack_410.result;
    uStack_790.data = (void *)(long)iVar1;
    uStack_5d0.data = (void *)0x0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188cb8;
    uStack_790.data = (void *)uStack_410.result;
    uStack_5d0.data = (void *)0x0;
    if (uStack_410.result < 0) goto LAB_00188cca;
    puStack_7b0 = (uv_loop_t *)0x188730;
    uv_fs_req_cleanup(&uStack_410);
    puStack_7b0 = (uv_loop_t *)0x188735;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x188749;
    iVar1 = uv_fs_close(puVar2,&uStack_5d0,(uv_os_fd_t)puVar4,(uv_fs_cb)0x0);
    uStack_790.data = (void *)(long)iVar1;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188cdc;
    puStack_7b0 = (uv_loop_t *)0x188776;
    uv_fs_req_cleanup(&uStack_5d0);
    puStack_7b0 = (uv_loop_t *)0x18877b;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x1887a0;
    iVar1 = uv_fs_open(puVar2,&uStack_410,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    uStack_790.data = (void *)(long)iVar1;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188ceb;
    uStack_790.data = (void *)uStack_410.result;
    lStack_7a0 = 0;
    puVar4 = (uv_fs_t *)uStack_410.result;
    if (uStack_410.result < 0) goto LAB_00188cfa;
    puStack_7b0 = (uv_loop_t *)0x1887f3;
    uv_fs_req_cleanup(&uStack_410);
    puStack_7b0 = (uv_loop_t *)0x1887f8;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x18880c;
    iVar1 = uv_fs_close(puVar2,&uStack_5d0,(uv_os_fd_t)uStack_410.result,(uv_fs_cb)0x0);
    uStack_790.data = (void *)(long)iVar1;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188d09;
    puStack_7b0 = (uv_loop_t *)0x188839;
    uv_fs_req_cleanup(&uStack_5d0);
    puStack_7b0 = (uv_loop_t *)0x18883e;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x18885d;
    iVar1 = uv_fs_mkdir(puVar2,&uStack_250,"test_dir/test_subdir",0x1ed,(uv_fs_cb)0x0);
    uStack_790.data = (void *)(long)iVar1;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188d18;
    puStack_7b0 = (uv_loop_t *)0x18888a;
    uv_fs_req_cleanup(&uStack_250);
    puVar4 = &opendir_req;
    puStack_7b0 = (uv_loop_t *)0x1888a3;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_7b0 = (uv_loop_t *)0x1888a8;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x1888bc;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",(uv_fs_cb)0x0);
    puVar3 = (uv_fs_t *)opendir_req.ptr;
    uStack_790.data = (void *)(long)iVar1;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188d27;
    uStack_790.data = (void *)(long)opendir_req.fs_type;
    lStack_7a0 = 0x1f;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x1f) goto LAB_00188d36;
    uStack_790.data = (void *)opendir_req.result;
    lStack_7a0 = 0;
    if (opendir_req.result != 0) goto LAB_00188d45;
    if (opendir_req.ptr == (void *)0x0) goto LAB_00188d54;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar3 + 8) = 1;
    puStack_7b0 = (uv_loop_t *)0x188954;
    uv_fs_req_cleanup(&opendir_req);
    puStack_7b0 = (uv_loop_t *)0x188959;
    puVar2 = uv_default_loop();
    lVar5 = 0;
    puStack_7b0 = (uv_loop_t *)0x188970;
    iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)puVar3,(uv_fs_cb)0x0);
    if (iVar1 != 0) {
      lVar5 = 0;
      do {
        __s1 = dirents[0].name;
        puStack_7b0 = (uv_loop_t *)0x1889a2;
        iVar1 = strcmp(dirents[0].name,"file1");
        if (iVar1 != 0) {
          puStack_7b0 = (uv_loop_t *)0x1889b5;
          iVar1 = strcmp(__s1,"file2");
          if (iVar1 == 0) goto LAB_001889cc;
          puStack_7b0 = (uv_loop_t *)0x1889c4;
          iVar1 = strcmp(__s1,"test_subdir");
          if (iVar1 == 0) goto LAB_001889cc;
LAB_00188c92:
          puStack_7b0 = (uv_loop_t *)0x188c97;
          run_test_fs_readdir_non_empty_dir_cold_10();
LAB_00188c97:
          puStack_7b0 = (uv_loop_t *)0x188ca6;
          run_test_fs_readdir_non_empty_dir_cold_12();
          goto LAB_00188ca6;
        }
LAB_001889cc:
        puStack_7b0 = (uv_loop_t *)0x1889d7;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) {
          uStack_790.data = (void *)(ulong)dirents[0].type;
          lStack_7a0 = 2;
          if ((uv_loop_t *)uStack_790.data == (uv_loop_t *)0x2) goto LAB_00188a24;
          goto LAB_00188c97;
        }
        uStack_790.data = (void *)(ulong)dirents[0].type;
        lStack_7a0 = 1;
        if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x1) {
          puStack_7b0 = (uv_loop_t *)0x188c92;
          run_test_fs_readdir_non_empty_dir_cold_11();
          goto LAB_00188c92;
        }
LAB_00188a24:
        uStack_790.data = (void *)(ulong)dirents[0].type;
        puStack_7b0 = (uv_loop_t *)0x188a2c;
        uv_fs_req_cleanup(&readdir_req);
        lVar5 = lVar5 + 1;
        puStack_7b0 = (uv_loop_t *)0x188a34;
        puVar2 = uv_default_loop();
        puStack_7b0 = (uv_loop_t *)0x188a44;
        iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)puVar3,(uv_fs_cb)0x0);
      } while (iVar1 != 0);
    }
    uStack_790.data = (uv_loop_t *)0x3;
    lStack_7a0 = lVar5;
    if (lVar5 != 3) goto LAB_00188d59;
    puStack_7b0 = (uv_loop_t *)0x188a76;
    uv_fs_req_cleanup(&readdir_req);
    puStack_7b0 = (uv_loop_t *)0x188a8f;
    memset(&closedir_req,0xdb,0x1c0);
    puStack_7b0 = (uv_loop_t *)0x188a94;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x188aa4;
    uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)puVar3,(uv_fs_cb)0x0);
    uStack_790.data = (void *)closedir_req.result;
    lStack_7a0 = 0;
    if (closedir_req.result != 0) goto LAB_00188d68;
    puStack_7b0 = (uv_loop_t *)0x188ad5;
    uv_fs_req_cleanup(&closedir_req);
    puVar3 = &opendir_req;
    puStack_7b0 = (uv_loop_t *)0x188aee;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_7b0 = (uv_loop_t *)0x188af3;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x188b0c;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    uStack_790.data = (void *)(long)iVar1;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188d77;
    uStack_790.data = (void *)(long)non_empty_opendir_cb_count;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188d86;
    uStack_790.data = (void *)(long)non_empty_closedir_cb_count;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188d95;
    puStack_7b0 = (uv_loop_t *)0x188b7b;
    puVar2 = uv_default_loop();
    puStack_7b0 = (uv_loop_t *)0x188b85;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    uStack_790.data = (void *)(long)iVar1;
    lStack_7a0 = 0;
    if ((uv_loop_t *)uStack_790.data != (uv_loop_t *)0x0) goto LAB_00188da4;
    uStack_790.data = (uv_loop_t *)0x1;
    lStack_7a0 = (long)non_empty_opendir_cb_count;
    if (lStack_7a0 != 1) goto LAB_00188db3;
    uStack_790.data = (uv_loop_t *)0x1;
    lStack_7a0 = (long)non_empty_closedir_cb_count;
    if (lStack_7a0 == 1) {
      puStack_7b0 = (uv_loop_t *)0x188bf4;
      puVar2 = uv_default_loop();
      puStack_7b0 = (uv_loop_t *)0x188c0d;
      uv_fs_rmdir(puVar2,&uStack_790,"test_subdir",(uv_fs_cb)0x0);
      puStack_7b0 = (uv_loop_t *)0x188c15;
      uv_fs_req_cleanup(&uStack_790);
      puStack_7b0 = (uv_loop_t *)0x188c1a;
      cleanup_test_files();
      puStack_7b0 = (uv_loop_t *)0x188c1f;
      puVar3 = (uv_fs_t *)uv_default_loop();
      puStack_7b0 = (uv_loop_t *)0x188c33;
      uv_walk((uv_loop_t *)puVar3,close_walk_cb,(void *)0x0);
      puStack_7b0 = (uv_loop_t *)0x188c3d;
      uv_run((uv_loop_t *)puVar3,UV_RUN_DEFAULT);
      lStack_7a0 = 0;
      puStack_7b0 = (uv_loop_t *)0x188c4b;
      puVar2 = uv_default_loop();
      puStack_7b0 = (uv_loop_t *)0x188c53;
      iVar1 = uv_loop_close(puVar2);
      lStack_798 = (long)iVar1;
      if (lStack_7a0 == lStack_798) {
        puStack_7b0 = (uv_loop_t *)0x188c6f;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00188dd1;
    }
  }
  else {
LAB_00188ca6:
    puStack_7b0 = (uv_loop_t *)0x188cb8;
    run_test_fs_readdir_non_empty_dir_cold_1();
LAB_00188cb8:
    puVar4 = puVar3;
    puStack_7b0 = (uv_loop_t *)0x188cca;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_00188cca:
    puStack_7b0 = (uv_loop_t *)0x188cdc;
    run_test_fs_readdir_non_empty_dir_cold_24();
LAB_00188cdc:
    puStack_7b0 = (uv_loop_t *)0x188ceb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_00188ceb:
    puStack_7b0 = (uv_loop_t *)0x188cfa;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_00188cfa:
    puStack_7b0 = (uv_loop_t *)0x188d09;
    run_test_fs_readdir_non_empty_dir_cold_23();
LAB_00188d09:
    puStack_7b0 = (uv_loop_t *)0x188d18;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_00188d18:
    puStack_7b0 = (uv_loop_t *)0x188d27;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_00188d27:
    puStack_7b0 = (uv_loop_t *)0x188d36;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_00188d36:
    puStack_7b0 = (uv_loop_t *)0x188d45;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_00188d45:
    puVar3 = puVar4;
    puStack_7b0 = (uv_loop_t *)0x188d54;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_00188d54:
    puStack_7b0 = (uv_loop_t *)0x188d59;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_00188d59:
    puStack_7b0 = (uv_loop_t *)0x188d68;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_00188d68:
    puStack_7b0 = (uv_loop_t *)0x188d77;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_00188d77:
    puStack_7b0 = (uv_loop_t *)0x188d86;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_00188d86:
    puStack_7b0 = (uv_loop_t *)0x188d95;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_00188d95:
    puStack_7b0 = (uv_loop_t *)0x188da4;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_00188da4:
    puStack_7b0 = (uv_loop_t *)0x188db3;
    run_test_fs_readdir_non_empty_dir_cold_18();
LAB_00188db3:
    puStack_7b0 = (uv_loop_t *)0x188dc2;
    run_test_fs_readdir_non_empty_dir_cold_19();
  }
  puStack_7b0 = (uv_loop_t *)0x188dd1;
  run_test_fs_readdir_non_empty_dir_cold_20();
LAB_00188dd1:
  puStack_7b0 = (uv_loop_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_21();
  puStack_7b0 = (uv_loop_t *)puVar3;
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_970,"test_dir/file1",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_970);
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_970,"test_dir/file2",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_970);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_970,"test_dir/test_subdir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_970);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_970,"test_dir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_970);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(fs_readdir_non_existing_dir) {
  const char* path;
  int r;

  path = "./non-existing-dir/";

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, NULL);
  ASSERT_EQ(r, UV_ENOENT);
  ASSERT_EQ(opendir_req.fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(opendir_req.result, UV_ENOENT);
  ASSERT_NULL(opendir_req.ptr);
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the async flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    non_existing_opendir_cb);
  ASSERT_OK(r);
  ASSERT_OK(non_existing_opendir_cb_count);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, non_existing_opendir_cb_count);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}